

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O1

Precision * __thiscall
icu_63::number::Precision::withCurrency
          (Precision *__return_storage_ptr__,Precision *this,CurrencyUnit *currency,
          UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  UNumberFormatRoundingMode UVar2;
  undefined4 uVar3;
  PrecisionType PVar4;
  undefined4 uVar5;
  int32_t iVar6;
  digits_t dVar7;
  undefined1 *currency_00;
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [18];
  bool local_59;
  double local_58;
  short local_50 [2];
  short local_4c [2];
  char local_48 [32];
  
  if (this->fType == RND_ERROR) {
    PVar4 = this->fType;
    uVar5 = *(undefined4 *)&this->field_0x4;
    FVar1 = (this->fUnion).fracSig;
    UVar2 = this->fRoundingMode;
    uVar3 = *(undefined4 *)&this->field_0x1c;
    *(undefined8 *)((long)&__return_storage_ptr__->fUnion + 8) =
         *(undefined8 *)((long)&this->fUnion + 8);
    __return_storage_ptr__->fRoundingMode = UVar2;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar3;
    __return_storage_ptr__->fType = PVar4;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar5;
    (__return_storage_ptr__->fUnion).fracSig = FVar1;
  }
  else {
    currency_00 = &(currency->super_MeasureUnit).field_0x14;
    local_58 = ucurr_getRoundingIncrementForUsage_63
                         ((UChar *)currency_00,(this->fUnion).currencyUsage,status);
    iVar6 = ucurr_getDefaultFractionDigitsForUsage_63
                      ((UChar *)currency_00,(this->fUnion).currencyUsage,status);
    dVar7 = (digits_t)iVar6;
    if ((local_58 != 0.0) || (NAN(local_58))) {
      double_conversion::DoubleToStringConverter::DoubleToAscii
                (local_58,SHORTEST,0,local_48,0x12,&local_59,(int *)local_4c,(int *)local_50);
      __return_storage_ptr__->fType = RND_INCREMENT;
      (__return_storage_ptr__->fUnion).increment.fIncrement = local_58;
      (__return_storage_ptr__->fUnion).increment.fMinFrac = dVar7;
      (__return_storage_ptr__->fUnion).increment.fMaxFrac = local_4c[0] - local_50[0];
    }
    else {
      __return_storage_ptr__->fType = RND_FRACTION;
      (__return_storage_ptr__->fUnion).fracSig.fMinFrac = dVar7;
      (__return_storage_ptr__->fUnion).fracSig.fMaxFrac = dVar7;
      *(undefined4 *)((long)&__return_storage_ptr__->fUnion + 4) = 0xffffffff;
    }
    __return_storage_ptr__->fRoundingMode = UNUM_FOUND_HALFEVEN;
  }
  return __return_storage_ptr__;
}

Assistant:

Precision Precision::withCurrency(const CurrencyUnit &currency, UErrorCode &status) const {
    if (fType == RND_ERROR) { return *this; } // no-op in error state
    U_ASSERT(fType == RND_CURRENCY);
    const char16_t *isoCode = currency.getISOCurrency();
    double increment = ucurr_getRoundingIncrementForUsage(isoCode, fUnion.currencyUsage, &status);
    int32_t minMaxFrac = ucurr_getDefaultFractionDigitsForUsage(
            isoCode, fUnion.currencyUsage, &status);
    if (increment != 0.0) {
        return constructIncrement(increment, minMaxFrac);
    } else {
        return constructFraction(minMaxFrac, minMaxFrac);
    }
}